

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_decoder.h
# Opt level: O3

uint32_t __thiscall draco::RAnsSymbolDecoder<3>::DecodeSymbol(RAnsSymbolDecoder<3> *this)

{
  uint8_t *puVar1;
  pointer prVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  
  uVar5 = (this->ans_).ans_.state;
  if (uVar5 < 0x4000) {
    uVar4 = (this->ans_).ans_.buf_offset;
    puVar1 = (this->ans_).ans_.buf;
    uVar3 = uVar5;
    do {
      uVar5 = uVar3;
      if ((int)uVar4 < 1) break;
      uVar4 = uVar4 - 1;
      (this->ans_).ans_.buf_offset = uVar4;
      uVar5 = (uint)puVar1[uVar4] | uVar3 << 8;
      (this->ans_).ans_.state = uVar5;
      bVar6 = uVar3 < 0x40;
      uVar3 = uVar5;
    } while (bVar6);
  }
  prVar2 = (this->ans_).probability_table_.
           super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (this->ans_).lut_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar5 & 0xfff];
  (this->ans_).ans_.state =
       ((uVar5 >> 0xc) * prVar2[uVar4].prob + (uVar5 & 0xfff)) - prVar2[uVar4].cum_prob;
  return uVar4;
}

Assistant:

uint32_t DecodeSymbol() { return ans_.rans_read(); }